

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_element.c
# Opt level: O0

apx_dataElement_t * apx_dataElement_new(apx_typeCode_t type_code)

{
  apx_error_t aVar1;
  apx_dataElement_t *paStack_18;
  apx_error_t result;
  apx_dataElement_t *self;
  apx_typeCode_t type_code_local;
  
  paStack_18 = (apx_dataElement_t *)malloc(0x38);
  if ((paStack_18 != (apx_dataElement_t *)0x0) &&
     (aVar1 = apx_dataElement_create(paStack_18,type_code), aVar1 != 0)) {
    free(paStack_18);
    paStack_18 = (apx_dataElement_t *)0x0;
  }
  return paStack_18;
}

Assistant:

apx_dataElement_t *apx_dataElement_new(apx_typeCode_t type_code)
{
   apx_dataElement_t *self = (apx_dataElement_t*) malloc(sizeof(apx_dataElement_t));
   if(self != NULL)
   {
      apx_error_t result = apx_dataElement_create(self, type_code);
      if (result != APX_NO_ERROR)
      {
         free(self);
         self = NULL;
      }
   }
   return self;
}